

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_tools.h
# Opt level: O2

bool math::matrix_is_diagonal<double>(double *mat,int rows,int cols,double *epsilon)

{
  double *pdVar1;
  double dVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  
  dVar2 = *epsilon;
  uVar3 = 0;
  if (0 < cols) {
    uVar3 = (ulong)(uint)cols;
  }
  uVar6 = 0;
  if (0 < rows) {
    uVar6 = (ulong)(uint)rows;
  }
  iVar7 = 1;
  uVar4 = 0;
  while( true ) {
    uVar5 = uVar3;
    if (uVar4 < uVar3) {
      uVar5 = uVar4;
    }
    if (uVar4 == uVar6) break;
    lVar8 = (long)iVar7;
    uVar9 = 0;
    while (uVar5 != uVar9) {
      pdVar1 = mat + uVar9;
      if ((0.0 < *pdVar1 - dVar2) || (uVar9 = uVar9 + 1, *pdVar1 + dVar2 < 0.0)) goto LAB_0011026b;
    }
    while (lVar8 < cols) {
      pdVar1 = mat + lVar8;
      if ((0.0 < *pdVar1 - dVar2) || (lVar8 = lVar8 + 1, *pdVar1 + dVar2 < 0.0)) goto LAB_0011026b;
    }
    iVar7 = iVar7 + 1;
    mat = mat + cols;
    uVar4 = uVar4 + 1;
  }
LAB_0011026b:
  return (long)rows <= (long)uVar4;
}

Assistant:

bool
matrix_is_diagonal (T* const mat, int rows, int cols, T const& epsilon)
{
    for (int y = 0; y < rows; ++y)
    {
        for (int x = 0; x < y && x < cols; ++x)
            if (!MATH_EPSILON_EQ(T(0), mat[y * cols + x], epsilon))
                return false;
        for (int x = y + 1; x < cols; ++x)
            if (!MATH_EPSILON_EQ(T(0), mat[y * cols + x], epsilon))
                return false;
    }
    return true;
}